

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O2

void __thiscall
adios2::transport::FileRemote::Read(FileRemote *this,char *buffer,size_t size,size_t start)

{
  Remote *pRVar1;
  int *piVar2;
  size_t sVar3;
  allocator local_1c3;
  allocator local_1c2;
  allocator local_1c1;
  string local_1c0;
  string local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (start == 0xffffffffffffffff) {
    sVar3 = this->m_SeekPos;
  }
  else {
    if (this->m_Size <= start) {
      std::__cxx11::string::string((string *)&local_a0,"Toolkit",(allocator *)&local_40);
      std::__cxx11::string::string
                ((string *)&local_c0,"transport::file::FileRemote",(allocator *)&local_60);
      std::__cxx11::string::string((string *)&local_e0,"Read",(allocator *)&local_80);
      std::__cxx11::to_string(&local_1a0,start);
      std::operator+(&local_180,"couldn\'t move to start position ",&local_1a0);
      std::operator+(&local_160,&local_180," beyond the size of ");
      std::operator+(&local_140,&local_160,&(this->super_Transport).m_Name);
      std::operator+(&local_120,&local_140," which is ");
      std::__cxx11::to_string(&local_1c0,this->m_Size);
      std::operator+(&local_100,&local_120,&local_1c0);
      helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_a0,&local_c0,&local_e0,&local_100,-1);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    this->m_SeekPos = start;
    piVar2 = __errno_location();
    *piVar2 = 0;
    this->m_Errno = 0;
    sVar3 = start;
  }
  if (this->m_Size < sVar3 + size) {
    std::__cxx11::string::string((string *)&local_a0,"Toolkit",&local_1c1);
    std::__cxx11::string::string((string *)&local_c0,"transport::file::FileRemote",&local_1c2);
    std::__cxx11::string::string((string *)&local_e0,"Read",&local_1c3);
    std::__cxx11::to_string(&local_40,size);
    std::operator+(&local_1c0,"can\'t read ",&local_40);
    std::operator+(&local_1a0,&local_1c0," bytes from position ");
    std::__cxx11::to_string(&local_60,this->m_SeekPos);
    std::operator+(&local_180,&local_1a0,&local_60);
    std::operator+(&local_160,&local_180," from ");
    std::operator+(&local_140,&local_160,&(this->super_Transport).m_Name);
    std::operator+(&local_120,&local_140," whose size is ");
    std::__cxx11::to_string(&local_80,this->m_Size);
    std::operator+(&local_100,&local_120,&local_80);
    helper::Throw<std::ios_base::failure[abi:cxx11]>(&local_a0,&local_c0,&local_e0,&local_100,-1);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  pRVar1 = (this->m_Remote)._M_t.
           super___uniq_ptr_impl<adios2::Remote,_std::default_delete<adios2::Remote>_>._M_t.
           super__Tuple_impl<0UL,_adios2::Remote_*,_std::default_delete<adios2::Remote>_>.
           super__Head_base<0UL,_adios2::Remote_*,_false>._M_head_impl;
  (*pRVar1->_vptr_Remote[7])(pRVar1,start,size,buffer);
  return;
}

Assistant:

void FileRemote::Read(char *buffer, size_t size, size_t start)
{
    WaitForOpen();

    if (start != MaxSizeT)
    {
        if (start >= m_Size)
        {
            helper::Throw<std::ios_base::failure>(
                "Toolkit", "transport::file::FileRemote", "Read",
                "couldn't move to start position " + std::to_string(start) +
                    " beyond the size of " + m_Name + " which is " + std::to_string(m_Size));
        }
        m_SeekPos = start;
        errno = 0;
        m_Errno = errno;
    }

    if (m_SeekPos + size > m_Size)
    {
        helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileRemote", "Read",
                                              "can't read " + std::to_string(size) +
                                                  " bytes from position " +
                                                  std::to_string(m_SeekPos) + " from " + m_Name +
                                                  " whose size is " + std::to_string(m_Size));
    }

    m_Remote->Read(start, size, buffer);
    if (m_IsCached)
    {
    }
}